

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void Excel::Parser::parseSST(Record *record,IStorage *storage)

{
  RecordSubstream *this;
  ulong uVar1;
  BiffVersion in_R9D;
  long lVar2;
  int32_t uniqueStrings;
  int32_t totalStrings;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  sst;
  uint local_74;
  wstring local_70;
  int local_4c;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_48;
  
  local_4c = 0;
  local_74 = 0;
  this = &record->m_stream;
  Stream::read<int>(&this->super_Stream,&local_4c,4);
  Stream::read<int>(&this->super_Stream,(int *)&local_74,4);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&local_48,(long)(int)local_74,(allocator_type *)&local_70);
  uVar1 = (ulong)local_74;
  if (0 < (int)local_74) {
    lVar2 = 0;
    do {
      loadString_abi_cxx11_
                (&local_70,(Excel *)this,(Stream *)&record->m_borders,
                 (vector<int,_std::allocator<int>_> *)0x2,0x600,in_R9D);
      (*storage->_vptr_IStorage[2])(storage,(long)(int)uVar1,lVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
      }
      lVar2 = lVar2 + 1;
      uVar1 = (ulong)(int)local_74;
    } while (lVar2 < (long)uVar1);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

inline void
Parser::parseSST( Record & record, IStorage & storage )
{
	int32_t totalStrings = 0;
	int32_t uniqueStrings = 0;

	record.dataStream().read( totalStrings, 4 );
	record.dataStream().read( uniqueStrings, 4 );

	std::vector< std::wstring > sst( uniqueStrings );

	for( int32_t i = 0; i < uniqueStrings; ++i )
		storage.onSharedString( uniqueStrings, i,
			loadString( record.dataStream(), record.borders() ) );
}